

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_map.h
# Opt level: O3

data_type * __thiscall
ctemplate::
small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
::operator[](small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
             *this,key_type *key)

{
  int iVar1;
  long lVar2;
  long lVar3;
  mapped_type *ppvVar4;
  ManualConstructor<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>_>
  *pMVar5;
  char *pcVar6;
  long lVar7;
  
  iVar1 = this->size_;
  lVar7 = (long)iVar1;
  if (-1 < lVar7) {
    lVar2 = lVar7 << 4;
    while (lVar3 = lVar2, lVar3 + -0x10 != -0x10) {
      lVar2 = lVar3 + -0x10;
      if (*(key_type *)((long)&this->size_ + lVar3) == *key) {
        return (data_type *)((long)&(this->functor_).arena_ + lVar3);
      }
    }
    if (iVar1 != 4) {
      pMVar5 = (this->field_2).array_ + lVar7;
      pcVar6 = pMVar5->space_ + 8;
      *(key_type *)pMVar5->space_ = *key;
      *(data_type *)pcVar6 = (data_type)0x0;
      this->size_ = iVar1 + 1;
      return (data_type *)pcVar6;
    }
    ConvertToRealMap(this);
  }
  ppvVar4 = std::
            map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>
            ::operator[]((map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>
                          *)&(this->field_2).dummy_,key);
  return ppvVar4;
}

Assistant:

data_type& operator[](const key_type& key) {
    key_equal compare;

    if (size_ >= 0) {
      // operator[] searches backwards, favoring recently-added
      // elements.
      for (int i = size_-1; i >= 0; --i) {
        if (compare(array_[i]->first, key)) {
          return array_[i]->second;
        }
      }
      if (size_ == kArraySize) {
        ConvertToRealMap();
        return (*map_)[key];
      } else {
        array_[size_].Init(key, data_type());
        return array_[size_++]->second;
      }
    } else {
      return (*map_)[key];
    }
  }